

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O3

void __thiscall Logger::Logger(Logger *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  Tools *pTVar3;
  long *plVar4;
  size_type *psVar5;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  pTVar3 = Tools::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,(pTVar3->path->_M_dataplus)._M_p,&local_39);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_38);
  paVar1 = &(this->loggerPath).field_2;
  (this->loggerPath)._M_dataplus._M_p = (pointer)paVar1;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    paVar1->_M_allocated_capacity = *psVar5;
    *(long *)((long)&(this->loggerPath).field_2 + 8) = lVar2;
  }
  else {
    (this->loggerPath)._M_dataplus._M_p = (pointer)*plVar4;
    (this->loggerPath).field_2._M_allocated_capacity = *psVar5;
  }
  (this->loggerPath)._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  std::ofstream::ofstream(&this->loggerFile);
  return;
}

Assistant:

Logger() {}